

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *ridx,int *rn,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  long in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  cpp_dec_float<200U,_int,_void> *in_R8;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int end;
  int n;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined1 local_668 [8];
  int *in_stack_fffffffffffff9a0;
  int *in_stack_fffffffffffff9a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9bc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9c0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff9c8;
  undefined1 local_5e8 [112];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffa90;
  undefined1 local_568 [128];
  undefined1 local_4e8 [128];
  undefined1 local_468 [256];
  undefined1 local_368 [128];
  undefined1 local_2e8 [128];
  undefined1 local_268 [128];
  long local_1e8;
  int *local_1e0;
  long local_1d8;
  long local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b4;
  uint local_134;
  undefined4 local_130;
  int local_12c;
  int local_128;
  int local_124;
  long local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  undefined1 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  long local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_f8 = &local_1b4;
  local_108 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
  local_1c0 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x6e27e2);
  local_1d8 = *(long *)(in_RDI[5].data._M_elems + 0x14);
  local_1d0._0_4_ = in_RDI[5].exp;
  local_1d0._4_1_ = in_RDI[5].neg;
  local_1d0._5_3_ = *(undefined3 *)&in_RDI[5].field_0x75;
  local_1e8 = *(long *)(in_RDI[5].data._M_elems + 0x1a);
  local_134 = in_RDI[5].data._M_elems[0x17];
  for (local_124 = 0; local_124 < (int)local_134; local_124 = local_124 + 1) {
    local_90 = local_108 + (long)*(int *)(local_1d0 + (long)local_124 * 4) * 0x80;
    local_88 = &local_1b4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(in_RDI,in_R8);
    local_e8 = local_268;
    local_f0 = &local_1b4;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_R8);
    local_d8 = local_2e8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_R8);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    if (bVar2) {
      local_12c = *(int *)(local_1e8 + (long)local_124 * 4);
      local_1e0 = (int *)(local_1d8 + (long)local_12c * 4);
      local_1c8 = local_1c0 + local_12c;
      for (local_128 = *(int *)(local_1e8 + (long)(local_124 + 1) * 4); local_12c < local_128;
          local_128 = local_128 + -1) {
        local_130 = *local_1e0;
        local_28 = local_368;
        local_30 = &local_1b4;
        local_38 = local_1c8;
        local_1e0 = local_1e0 + 1;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30,local_1c8);
        local_20 = local_368;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
        local_8 = local_368;
        local_10 = local_30;
        local_18 = local_38;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_RDI,in_R8,(cpp_dec_float<200U,_int,_void> *)0x6e2a81);
        updateSolutionVectorLright
                  (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc,
                   in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
        local_1c8 = local_1c8 + 1;
      }
    }
  }
  if (in_RDI[5].fpclass != cpp_dec_float_finite) {
    local_134 = in_RDI[5].data._M_elems[0x18];
    for (; local_124 < (int)local_134; local_124 = local_124 + 1) {
      local_12c = *(int *)(local_1e8 + (long)local_124 * 4);
      local_1e0 = (int *)(local_1d8 + (long)local_12c * 4);
      local_1c8 = local_1c0 + local_12c;
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_RDI);
      for (local_128 = *(int *)(local_1e8 + (long)(local_124 + 1) * 4); pnVar1 = local_1c8,
          local_12c < local_128; local_128 = local_128 + -1) {
        local_70 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(local_108 + (long)*local_1e0 * 0x80);
        local_68 = local_468;
        local_78 = local_1c8;
        local_1e0 = local_1e0 + 1;
        local_1c8 = local_1c8 + 1;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_79,local_70,pnVar1);
        local_60 = local_468;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
        local_48 = local_468;
        local_50 = local_70;
        local_58 = local_78;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_RDI,in_R8,(cpp_dec_float<200U,_int,_void> *)0x6e2cc1);
        StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator+=((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_RDI,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_R8);
      }
      local_128 = *(int *)(local_1d0 + (long)local_124 * 4);
      StableSum::operator_cast_to_number
                ((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_R8);
      local_98 = &local_1b4;
      local_a0 = local_4e8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(in_RDI,in_R8);
      local_c8 = local_568;
      local_d0 = &local_1b4;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_R8);
      local_b8 = local_5e8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_R8);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      if (bVar2) {
        local_a8 = local_668;
        local_b0 = &local_1b4;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_R8)
        ;
        updateSolutionVectorLright
                  (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc,
                   in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright(R* vec, int* ridx, int& rn, R eps)
{
   int i, j, k, n;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      x = vec[lrow[i]];

      // check whether there is a corresponding value in the rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // apply \f$- x * L_{k,i}\f$ to all corresponding values in rhs/solution VectorBase<R>
         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp += vec[*idx++] * (*val++);
         }

         j = lrow[i];
         x = R(tmp);

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);
      }
   }
}